

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O1

void __thiscall
indigox::algorithm::AStarOptimisation::PopulateInitialDistribution
          (AStarOptimisation *this,p_AStarQueueItem *d)

{
  VertMask *pVVar1;
  ulong *puVar2;
  ElectronOpt *pEVar3;
  element_type *peVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer ppVar8;
  pointer ppVar9;
  bool bVar10;
  byte bVar11;
  AdjList *g;
  mapped_type *__k;
  mapped_type_conflict1 *pmVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  MolVertPair startID;
  allocator<unsigned_long> local_79;
  undefined1 local_78 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  p_AStarQueueItem local_48;
  p_AStarQueueItem local_38;
  
  pEVar3 = (this->super_ElectronOptimisationAlgorithm).parent_;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             (long)(pEVar3->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar3->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,0,&local_79);
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((element_type *)local_78 != peVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)peVar4);
    (peVar4->distribution).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  puVar5 = (peVar4->distribution).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = *(pointer *)
            ((long)&(peVar4->distribution).m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (puVar5 != puVar6) {
    memset(puVar5,0,(long)puVar6 - (long)puVar5 & 0xfffffffffffffff8);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             *(size_t *)
              ((long)&((((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super__ElnGraph).graph_.
                       super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_type + 0x28),0,&local_79);
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pVVar1 = &peVar4->unchangeable;
  if ((element_type *)local_78 != (element_type *)pVVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&pVVar1->m_bits,local_78);
    (peVar4->unchangeable).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->unchangeable);
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((peVar4->unchangeable).m_num_bits != 0) {
    puVar7 = (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar14 = (long)(this->uniqueIDs_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar7;
    uVar13 = 0;
    uVar15 = 1;
    do {
      if (uVar14 <= uVar13) goto LAB_00118caa;
      if (puVar7[uVar13] != '\0') {
        bVar11 = (byte)uVar13 & 0x3f;
        puVar2 = (ulong *)((long)(peVar4->unchangeable).m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + (uVar13 >> 6) * 8);
        *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
      }
      bVar10 = uVar15 < (peVar4->unchangeable).m_num_bits;
      uVar13 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar10);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             *(size_t *)
              ((long)&((((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super__ElnGraph).graph_.
                       super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_type + 0x28),0,&local_79);
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((element_type *)local_78 != (element_type *)&peVar4->calculable) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign();
    (peVar4->calculable).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  puVar5 = (peVar4->calculable).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (peVar4->calculable).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar6) {
    memset(puVar5,0,(long)puVar6 - (long)puVar5 & 0xfffffffffffffff8);
  }
  local_38.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_38.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_38.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar4;
  DetermineCalculable(this,&local_38);
  if (local_38.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             &(peVar4->calculable).m_bits);
  local_78._24_8_ = (peVar4->calculable).m_num_bits;
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pVVar1 = &peVar4->new_calculable;
  if ((element_type *)local_78 != (element_type *)pVVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&pVVar1->m_bits,local_78);
    (peVar4->new_calculable).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  local_48.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  (local_48.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr)->parent_path_cost = 0;
  local_48.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_48.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CalculatePathEnergy(this,&local_48);
  if (local_48.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar4->path_cost != Options::AssignElectrons::INF) {
    local_50 = (d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
    local_78._32_8_ = peVar4;
    CalculateHeuristicEnergy(this,(p_AStarQueueItem *)(local_78 + 0x20));
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
  }
  peVar4 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar4->nbr_start_idx = 0;
  pEVar3 = (this->super_ElectronOptimisationAlgorithm).parent_;
  ppVar8 = (pEVar3->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 == (pEVar3->possibleLocations_).
                super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    peVar4->nbr_count = '\0';
  }
  else {
    ppVar9 = (pEVar3->possibleLocations_).
             super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar8 == ppVar9) goto LAB_00118cb1;
    local_78._0_8_ = ppVar9->first;
    local_78._8_8_ = ppVar9->second;
    __k = std::
          map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
          ::at(&this->idsToVertex_,(key_type *)local_78);
    pmVar12 = std::
              map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              ::at(&this->vert2pos_,__k);
    uVar13 = *pmVar12;
    puVar7 = (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar14 = (long)(this->uniqueIDs_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar7;
    if (uVar14 <= uVar13) {
LAB_00118caa:
      do {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar13,uVar14);
LAB_00118cb1:
        uVar13 = 0;
        uVar14 = 0;
      } while( true );
    }
    ((d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ->nbr_count = puVar7[uVar13];
  }
  return;
}

Assistant:

void AStarOptimisation::PopulateInitialDistribution(p_AStarQueueItem d) {
  d->distribution = ElnDist(parent_->possibleLocations_.size());
  d->distribution.reset();
  
  d->unchangeable = VertMask(parent_->elnGraph_->NumVertices());
  d->unchangeable.set();
  for (unsigned int i = 0; i < d->unchangeable.size(); ++i) {
    if (uniqueIDs_.at(i) > 0)
      d->unchangeable.reset(i);
  }
  
  d->calculable = VertMask(parent_->elnGraph_->NumVertices());
  d->calculable.reset();
  DetermineCalculable(d);
  d->new_calculable = VertMask(d->calculable);
  
  d->parent_path_cost = 0;
  CalculatePathEnergy(d);
  if (d->path_cost != opt_::INF) CalculateHeuristicEnergy(d);
  
  d->nbr_start_idx = 0;
  if (parent_->possibleLocations_.size()) {
    MolVertPair startID = parent_->possibleLocations_.at(0);
    size_t startVert = vert2pos_.at(idsToVertex_.at(startID));
    d->nbr_count = (uint32_t)uniqueIDs_.at(startVert);
  } else d->nbr_count = 0;
}